

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# F3DAudio.c
# Opt level: O0

uint8_t CheckCone(F3DAUDIO_CONE *pCone)

{
  code *pcVar1;
  uint8_t uVar2;
  int iVar3;
  float *in_RDI;
  SDL_AssertState sdl_assert_state_15;
  SDL_AssertState sdl_assert_state_14;
  SDL_AssertState sdl_assert_state_13;
  SDL_AssertState sdl_assert_state_12;
  SDL_AssertState sdl_assert_state_11;
  SDL_AssertState sdl_assert_state_10;
  SDL_AssertState sdl_assert_state_9;
  SDL_AssertState sdl_assert_state_8;
  SDL_AssertState sdl_assert_state_7;
  SDL_AssertState sdl_assert_state_6;
  SDL_AssertState sdl_assert_state_5;
  SDL_AssertState sdl_assert_state_4;
  SDL_AssertState sdl_assert_state_3;
  SDL_AssertState sdl_assert_state_2;
  SDL_AssertState sdl_assert_state_1;
  SDL_AssertState sdl_assert_state;
  
  if (in_RDI != (float *)0x0) {
    do {
      if (0.0 <= *in_RDI) goto LAB_0010c828;
      iVar3 = SDL_ReportAssertion(&CheckCone::sdl_assert_data,"CheckCone",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/0x0ade[P]FAudio/src/F3DAudio.c"
                                  ,0xfd);
    } while (iVar3 == 0);
    if (iVar3 == 1) {
      pcVar1 = (code *)swi(3);
      uVar2 = (*pcVar1)();
      return uVar2;
    }
LAB_0010c828:
    do {
      if (*in_RDI <= 6.2831855) goto LAB_0010c892;
      iVar3 = SDL_ReportAssertion(&CheckCone::sdl_assert_data_1,"CheckCone",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/0x0ade[P]FAudio/src/F3DAudio.c"
                                  ,0xfd);
    } while (iVar3 == 0);
    if (iVar3 == 1) {
      pcVar1 = (code *)swi(3);
      uVar2 = (*pcVar1)();
      return uVar2;
    }
LAB_0010c892:
    do {
      if (*in_RDI <= in_RDI[1]) goto LAB_0010c8fe;
      iVar3 = SDL_ReportAssertion(&CheckCone::sdl_assert_data_2,"CheckCone",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/0x0ade[P]FAudio/src/F3DAudio.c"
                                  ,0xfe);
    } while (iVar3 == 0);
    if (iVar3 == 1) {
      pcVar1 = (code *)swi(3);
      uVar2 = (*pcVar1)();
      return uVar2;
    }
LAB_0010c8fe:
    do {
      if (in_RDI[1] <= 6.2831855) goto LAB_0010c969;
      iVar3 = SDL_ReportAssertion(&CheckCone::sdl_assert_data_3,"CheckCone",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/0x0ade[P]FAudio/src/F3DAudio.c"
                                  ,0xfe);
    } while (iVar3 == 0);
    if (iVar3 == 1) {
      pcVar1 = (code *)swi(3);
      uVar2 = (*pcVar1)();
      return uVar2;
    }
LAB_0010c969:
    do {
      if (0.0 <= in_RDI[2]) goto LAB_0010c9d3;
      iVar3 = SDL_ReportAssertion(&CheckCone::sdl_assert_data_4,"CheckCone",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/0x0ade[P]FAudio/src/F3DAudio.c"
                                  ,0x100);
    } while (iVar3 == 0);
    if (iVar3 == 1) {
      pcVar1 = (code *)swi(3);
      uVar2 = (*pcVar1)();
      return uVar2;
    }
LAB_0010c9d3:
    do {
      if (in_RDI[2] <= 2.0) goto LAB_0010ca3e;
      iVar3 = SDL_ReportAssertion(&CheckCone::sdl_assert_data_5,"CheckCone",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/0x0ade[P]FAudio/src/F3DAudio.c"
                                  ,0x100);
    } while (iVar3 == 0);
    if (iVar3 == 1) {
      pcVar1 = (code *)swi(3);
      uVar2 = (*pcVar1)();
      return uVar2;
    }
LAB_0010ca3e:
    do {
      if (0.0 <= in_RDI[3]) goto LAB_0010caa8;
      iVar3 = SDL_ReportAssertion(&CheckCone::sdl_assert_data_6,"CheckCone",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/0x0ade[P]FAudio/src/F3DAudio.c"
                                  ,0x101);
    } while (iVar3 == 0);
    if (iVar3 == 1) {
      pcVar1 = (code *)swi(3);
      uVar2 = (*pcVar1)();
      return uVar2;
    }
LAB_0010caa8:
    do {
      if (in_RDI[3] <= 2.0) goto LAB_0010cb13;
      iVar3 = SDL_ReportAssertion(&CheckCone::sdl_assert_data_7,"CheckCone",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/0x0ade[P]FAudio/src/F3DAudio.c"
                                  ,0x101);
    } while (iVar3 == 0);
    if (iVar3 == 1) {
      pcVar1 = (code *)swi(3);
      uVar2 = (*pcVar1)();
      return uVar2;
    }
LAB_0010cb13:
    do {
      if (0.0 <= in_RDI[4]) goto LAB_0010cb7d;
      iVar3 = SDL_ReportAssertion(&CheckCone::sdl_assert_data_8,"CheckCone",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/0x0ade[P]FAudio/src/F3DAudio.c"
                                  ,0x103);
    } while (iVar3 == 0);
    if (iVar3 == 1) {
      pcVar1 = (code *)swi(3);
      uVar2 = (*pcVar1)();
      return uVar2;
    }
LAB_0010cb7d:
    do {
      if (in_RDI[4] <= 1.0) goto LAB_0010cbe8;
      iVar3 = SDL_ReportAssertion(&CheckCone::sdl_assert_data_9,"CheckCone",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/0x0ade[P]FAudio/src/F3DAudio.c"
                                  ,0x103);
    } while (iVar3 == 0);
    if (iVar3 == 1) {
      pcVar1 = (code *)swi(3);
      uVar2 = (*pcVar1)();
      return uVar2;
    }
LAB_0010cbe8:
    do {
      if (0.0 <= in_RDI[5]) goto LAB_0010cc52;
      iVar3 = SDL_ReportAssertion(&CheckCone::sdl_assert_data_10,"CheckCone",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/0x0ade[P]FAudio/src/F3DAudio.c"
                                  ,0x104);
    } while (iVar3 == 0);
    if (iVar3 == 1) {
      pcVar1 = (code *)swi(3);
      uVar2 = (*pcVar1)();
      return uVar2;
    }
LAB_0010cc52:
    do {
      if (in_RDI[5] <= 1.0) goto LAB_0010ccbd;
      iVar3 = SDL_ReportAssertion(&CheckCone::sdl_assert_data_11,"CheckCone",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/0x0ade[P]FAudio/src/F3DAudio.c"
                                  ,0x104);
    } while (iVar3 == 0);
    if (iVar3 == 1) {
      pcVar1 = (code *)swi(3);
      uVar2 = (*pcVar1)();
      return uVar2;
    }
LAB_0010ccbd:
    do {
      if (0.0 <= in_RDI[6]) goto LAB_0010cd27;
      iVar3 = SDL_ReportAssertion(&CheckCone::sdl_assert_data_12,"CheckCone",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/0x0ade[P]FAudio/src/F3DAudio.c"
                                  ,0x106);
    } while (iVar3 == 0);
    if (iVar3 == 1) {
      pcVar1 = (code *)swi(3);
      uVar2 = (*pcVar1)();
      return uVar2;
    }
LAB_0010cd27:
    do {
      if (in_RDI[6] <= 2.0) goto LAB_0010cd92;
      iVar3 = SDL_ReportAssertion(&CheckCone::sdl_assert_data_13,"CheckCone",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/0x0ade[P]FAudio/src/F3DAudio.c"
                                  ,0x106);
    } while (iVar3 == 0);
    if (iVar3 == 1) {
      pcVar1 = (code *)swi(3);
      uVar2 = (*pcVar1)();
      return uVar2;
    }
LAB_0010cd92:
    do {
      if (0.0 <= in_RDI[7]) goto LAB_0010cdfc;
      iVar3 = SDL_ReportAssertion(&CheckCone::sdl_assert_data_14,"CheckCone",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/0x0ade[P]FAudio/src/F3DAudio.c"
                                  ,0x107);
    } while (iVar3 == 0);
    if (iVar3 == 1) {
      pcVar1 = (code *)swi(3);
      uVar2 = (*pcVar1)();
      return uVar2;
    }
LAB_0010cdfc:
    do {
      if (in_RDI[7] <= 2.0) {
        return '\x01';
      }
      iVar3 = SDL_ReportAssertion(&CheckCone::sdl_assert_data_15,"CheckCone",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/0x0ade[P]FAudio/src/F3DAudio.c"
                                  ,0x107);
    } while (iVar3 == 0);
    if (iVar3 == 1) {
      pcVar1 = (code *)swi(3);
      uVar2 = (*pcVar1)();
      return uVar2;
    }
  }
  return '\x01';
}

Assistant:

static inline uint8_t CheckCone(F3DAUDIO_CONE *pCone)
{
	if (!pCone)
	{
		return PARAM_CHECK_OK;
	}

	FLOAT_BETWEEN_CHECK(pCone->InnerAngle, 0.0f, F3DAUDIO_2PI);
	FLOAT_BETWEEN_CHECK(pCone->OuterAngle, pCone->InnerAngle, F3DAUDIO_2PI);

	FLOAT_BETWEEN_CHECK(pCone->InnerVolume, 0.0f, 2.0f);
	FLOAT_BETWEEN_CHECK(pCone->OuterVolume, 0.0f, 2.0f);

	FLOAT_BETWEEN_CHECK(pCone->InnerLPF, 0.0f, 1.0f);
	FLOAT_BETWEEN_CHECK(pCone->OuterLPF, 0.0f, 1.0f);

	FLOAT_BETWEEN_CHECK(pCone->InnerReverb, 0.0f, 2.0f);
	FLOAT_BETWEEN_CHECK(pCone->OuterReverb, 0.0f, 2.0f);

	return PARAM_CHECK_OK;
}